

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzma2_decoder.c
# Opt level: O1

lzma_ret lzma2_decoder_init(lzma_lz_decoder *lz,lzma_allocator *allocator,void *opt,
                           lzma_lz_options *lz_options)

{
  lzma_ret lVar1;
  undefined4 *puVar2;
  bool bVar3;
  
  puVar2 = (undefined4 *)lz->coder;
  if (puVar2 == (undefined4 *)0x0) {
    puVar2 = (undefined4 *)lzma_alloc(0xb8,allocator);
    if (puVar2 == (undefined4 *)0x0) {
      return LZMA_MEM_ERROR;
    }
    lz->coder = puVar2;
    lz->code = lzma2_decode;
    lz->end = lzma2_decoder_end;
    *(undefined8 *)(puVar2 + 6) = 0;
    *(undefined8 *)(puVar2 + 8) = 0;
    *(undefined8 *)(puVar2 + 2) = 0;
    *(undefined8 *)(puVar2 + 4) = 0;
    *(undefined8 *)(puVar2 + 10) = 0;
  }
  *puVar2 = 0;
  *(undefined1 *)(puVar2 + 0x10) = 1;
  if (*(long *)((long)opt + 8) == 0) {
    bVar3 = true;
  }
  else {
    bVar3 = *(int *)((long)opt + 0x10) == 0;
  }
  *(bool *)((long)puVar2 + 0x41) = bVar3;
  lVar1 = lzma_lzma_decoder_create((lzma_lz_decoder *)(puVar2 + 2),allocator,opt,lz_options);
  return lVar1;
}

Assistant:

static lzma_ret
lzma2_decoder_init(lzma_lz_decoder *lz, const lzma_allocator *allocator,
		const void *opt, lzma_lz_options *lz_options)
{
	lzma_lzma2_coder *coder = lz->coder;
	if (coder == NULL) {
		coder = lzma_alloc(sizeof(lzma_lzma2_coder), allocator);
		if (coder == NULL)
			return LZMA_MEM_ERROR;

		lz->coder = coder;
		lz->code = &lzma2_decode;
		lz->end = &lzma2_decoder_end;

		coder->lzma = LZMA_LZ_DECODER_INIT;
	}

	const lzma_options_lzma *options = opt;

	coder->sequence = SEQ_CONTROL;
	coder->need_properties = true;
	coder->need_dictionary_reset = options->preset_dict == NULL
			|| options->preset_dict_size == 0;

	return lzma_lzma_decoder_create(&coder->lzma,
			allocator, options, lz_options);
}